

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

NumberParseMatcher * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::nextCodePointMatcher
          (CodePointMatcherWarehouse *this,UChar32 cp)

{
  CodePointMatcher *pCVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  CodePointMatcher *pCVar6;
  NumberParseMatcher local_28;
  UChar32 local_20;
  
  iVar5 = this->codePointCount;
  lVar2 = (long)iVar5;
  if (lVar2 < 5) {
    this->codePointCount = iVar5 + 1;
    pCVar6 = (this->codePoints)._M_elems + lVar2;
    (this->codePoints)._M_elems[lVar2].fCp = cp;
  }
  else {
    iVar4 = this->codePointNumBatches;
    if (iVar4 * 10 + 5 <= iVar5) {
      puVar3 = (undefined8 *)
               UMemory::operator_new__((UMemory *)0xa8,CONCAT44(in_register_00000034,cp));
      if (puVar3 == (undefined8 *)0x0) {
        pCVar6 = (CodePointMatcher *)0x0;
      }
      else {
        *puVar3 = 10;
        lVar2 = 8;
        do {
          *(undefined ***)((long)puVar3 + lVar2) = &PTR__NumberParseMatcher_003d8e20;
          lVar2 = lVar2 + 0x10;
        } while (lVar2 != 0xa8);
        pCVar6 = (CodePointMatcher *)(puVar3 + 1);
      }
      iVar5 = this->codePointNumBatches;
      if ((this->codePointsOverflow).capacity <= iVar5) {
        MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::resize
                  (&this->codePointsOverflow,iVar5 * 2,iVar5);
        iVar5 = this->codePointNumBatches;
      }
      iVar4 = iVar5 + 1;
      this->codePointNumBatches = iVar4;
      (this->codePointsOverflow).ptr[iVar5] = pCVar6;
      iVar5 = this->codePointCount;
    }
    pCVar1 = (this->codePointsOverflow).ptr[(long)iVar4 + -1];
    this->codePointCount = iVar5 + 1;
    iVar5 = (iVar5 + -5) % 10;
    pCVar6 = pCVar1 + iVar5;
    pCVar1[iVar5].fCp = cp;
  }
  local_28._vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003d8e20;
  local_20 = cp;
  NumberParseMatcher::~NumberParseMatcher(&local_28);
  return &pCVar6->super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& CodePointMatcherWarehouse::nextCodePointMatcher(UChar32 cp) {
    if (codePointCount < CODE_POINT_STACK_CAPACITY) {
        return codePoints[codePointCount++] = {cp};
    }
    int32_t totalCapacity = CODE_POINT_STACK_CAPACITY + codePointNumBatches * CODE_POINT_BATCH_SIZE;
    if (codePointCount >= totalCapacity) {
        // Need a new batch
        auto* nextBatch = new CodePointMatcher[CODE_POINT_BATCH_SIZE];
        if (codePointNumBatches >= codePointsOverflow.getCapacity()) {
            // Need more room for storing pointers to batches
            codePointsOverflow.resize(codePointNumBatches * 2, codePointNumBatches);
        }
        codePointsOverflow[codePointNumBatches++] = nextBatch;
    }
    return codePointsOverflow[codePointNumBatches - 1][(codePointCount++ - CODE_POINT_STACK_CAPACITY) %
                                                       CODE_POINT_BATCH_SIZE] = {cp};
}